

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986Fragment(xmlURIPtr uri,char **str)

{
  int iVar1;
  xmlChar *pxVar2;
  char *pcVar3;
  bool bVar4;
  char *local_28;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  local_28 = *str;
  while( true ) {
    iVar1 = xmlIsUnreserved(uri,local_28);
    bVar4 = true;
    if (((iVar1 == 0) &&
        ((((*local_28 != '%' ||
           ((((local_28[1] < '0' || ('9' < local_28[1])) &&
             ((local_28[1] < 'a' || ('f' < local_28[1])))) &&
            ((local_28[1] < 'A' || ('F' < local_28[1])))))) ||
          (((local_28[2] < '0' || (bVar4 = true, '9' < local_28[2])) &&
           (((local_28[2] < 'a' || (bVar4 = true, 'f' < local_28[2])) &&
            ((local_28[2] < 'A' || (bVar4 = true, 'F' < local_28[2])))))))) &&
         ((((bVar4 = true, *local_28 != '!' && (bVar4 = true, *local_28 != '$')) &&
           (bVar4 = true, *local_28 != '&')) &&
          ((((bVar4 = true, *local_28 != '(' && (bVar4 = true, *local_28 != ')')) &&
            ((bVar4 = true, *local_28 != '*' &&
             (((bVar4 = true, *local_28 != '+' && (bVar4 = true, *local_28 != ',')) &&
              ((bVar4 = true, *local_28 != ';' &&
               ((((bVar4 = true, *local_28 != '=' && (bVar4 = true, *local_28 != '\'')) &&
                 (bVar4 = true, *local_28 != ':')) &&
                ((bVar4 = true, *local_28 != '@' && (bVar4 = true, *local_28 != '/')))))))))))) &&
           (bVar4 = true, *local_28 != '?')))))))) && (bVar4 = true, *local_28 != '[')) {
      bVar4 = *local_28 == ']';
    }
    if (!bVar4) break;
    if (*local_28 == '%') {
      local_28 = local_28 + 3;
    }
    else {
      local_28 = local_28 + 1;
    }
  }
  if (uri != (xmlURIPtr)0x0) {
    if (uri->fragment != (char *)0x0) {
      (*xmlFree)(uri->fragment);
    }
    if ((uri->cleanup & 2U) == 0) {
      pcVar3 = xmlURIUnescapeString(*str,(int)local_28 - (int)*str,(char *)0x0);
      uri->fragment = pcVar3;
    }
    else {
      pxVar2 = xmlStrndup((xmlChar *)*str,(int)local_28 - (int)*str);
      uri->fragment = (char *)pxVar2;
    }
    if (uri->fragment == (char *)0x0) {
      return -1;
    }
  }
  *str = local_28;
  return 0;
}

Assistant:

static int
xmlParse3986Fragment(xmlURIPtr uri, const char **str)
{
    const char *cur;

    cur = *str;

    while ((ISA_PCHAR(uri, cur)) || (*cur == '/') || (*cur == '?') ||
           (*cur == '[') || (*cur == ']'))
        NEXT(cur);
    if (uri != NULL) {
        if (uri->fragment != NULL)
            xmlFree(uri->fragment);
	if (uri->cleanup & XML_URI_NO_UNESCAPE)
	    uri->fragment = STRNDUP(*str, cur - *str);
	else
	    uri->fragment = xmlURIUnescapeString(*str, cur - *str, NULL);
        if (uri->fragment == NULL)
            return (-1);
    }
    *str = cur;
    return (0);
}